

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O1

void __thiscall amrex::ClusterList::~ClusterList(ClusterList *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  iterator End;
  
  for (p_Var1 = (this->lst).super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>.
                _M_impl._M_node.super__List_node_base._M_next; p_Var1 != (_List_node_base *)this;
      p_Var1 = (((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)&p_Var1->_M_next)->
               super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>)._M_impl.
               _M_node.super__List_node_base._M_next) {
    if (*(void **)&((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)(p_Var1 + 1))->
                   super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> !=
        (void *)0x0) {
      operator_delete(*(void **)&((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)
                                 (p_Var1 + 1))->
                                 super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>
                      ,0x30);
    }
  }
  p_Var1 = (this->lst).super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  while (p_Var1 != (_List_node_base *)this) {
    p_Var2 = (((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)&p_Var1->_M_next)->
             super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var1,0x18);
    p_Var1 = p_Var2;
  }
  return;
}

Assistant:

ClusterList::~ClusterList ()
{
    for (std::list<Cluster*>::iterator cli = lst.begin(), End = lst.end();
         cli != End;
         ++cli)
    {
        delete *cli;
    }
}